

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utp_stream.cpp
# Opt level: O2

void libtorrent::aux::utp_stream::on_read
               (utp_stream *s,size_t bytes_transferred,error_code *ec,bool shutdown)

{
  undefined1 *puVar1;
  io_context *ctx;
  _Manager_type p_Var2;
  _Any_data local_58;
  _Manager_type local_48;
  _Invoker_type local_40;
  size_t local_38;
  undefined8 local_30;
  error_category *peStack_28;
  
  ctx = s->m_io_service;
  local_58._M_unused._M_object = (void *)0x0;
  local_58._8_8_ = 0;
  local_48 = (_Manager_type)0x0;
  local_40 = (s->m_read_handler)._M_invoker;
  p_Var2 = (s->m_read_handler).super__Function_base._M_manager;
  if (p_Var2 != (_Manager_type)0x0) {
    local_58._M_unused._0_8_ =
         (undefined8)*(undefined8 *)&(s->m_read_handler).super__Function_base._M_functor;
    local_58._8_8_ = *(undefined8 *)((long)&(s->m_read_handler).super__Function_base._M_functor + 8)
    ;
    (s->m_read_handler).super__Function_base._M_manager = (_Manager_type)0x0;
    (s->m_read_handler)._M_invoker = (_Invoker_type)0x0;
    local_48 = p_Var2;
  }
  local_30._0_4_ = ec->val_;
  local_30._4_1_ = ec->failed_;
  local_30._5_3_ = *(undefined3 *)&ec->field_0x5;
  peStack_28 = ec->cat_;
  local_38 = bytes_transferred;
  boost::asio::
  post<boost::asio::io_context,std::_Bind_result<void,std::function<void(boost::system::error_code_const&,unsigned_long)>(boost::system::error_code,unsigned_long)>>
            (ctx,(_Bind_result<void,_std::function<void_(const_boost::system::error_code_&,_unsigned_long)>_(boost::system::error_code,_unsigned_long)>
                  *)&local_58,(type *)0x0);
  ::std::_Function_base::~_Function_base((_Function_base *)&local_58);
  ::std::function<void_(const_boost::system::error_code_&,_unsigned_long)>::operator=
            (&s->m_read_handler,(nullptr_t)0x0);
  if ((shutdown) && (s->m_impl != (utp_socket_impl *)0x0)) {
    puVar1 = &s->m_impl->field_0x21c;
    *puVar1 = *puVar1 & 0x7f;
    s->m_impl = (utp_socket_impl *)0x0;
  }
  return;
}

Assistant:

void utp_stream::on_read(utp_stream* s, std::size_t const bytes_transferred
	, error_code const& ec, bool const shutdown)
{
	UTP_LOGV("%8p: calling read handler read:%d ec:%s shutdown:%d\n", static_cast<void*>(s->m_impl)
		, int(bytes_transferred), ec.message().c_str(), shutdown);

	TORRENT_ASSERT(s->m_read_handler);
	TORRENT_ASSERT(bytes_transferred > 0 || ec || s->m_impl->null_buffers());
	post(s->m_io_service, std::bind<void>(std::move(s->m_read_handler), ec, bytes_transferred));
	s->m_read_handler = nullptr;
	if (shutdown && s->m_impl)
	{
		TORRENT_ASSERT(ec);
		s->m_impl->detach();
		s->m_impl = nullptr;
	}
}